

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O0

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  ulong in_RDX;
  size_t n_local;
  cacheblock_t *dst_local;
  TempSpace *src_local;
  void *pvVar2;
  
  if (*(ulong *)(dst + 0x10) < in_RDX) {
    memcpy(src,*(void **)dst,*(long *)(dst + 0x10) << 4);
    pvVar2 = memcpy(src + *(long *)(dst + 0x10) * 0x10,*(void **)(dst + 8),
                    (in_RDX - *(long *)(dst + 0x10)) * 0x10);
    iVar1 = (int)pvVar2;
  }
  else {
    pvVar2 = memcpy(src,*(void **)dst,in_RDX << 4);
    iVar1 = (int)pvVar2;
  }
  return iVar1;
}

Assistant:

static inline void
copy(TempSpace& src, cacheblock_t* dst, size_t n)
{
	if (n > src.elements_in_strings) {
		(void) memcpy(dst, src.strings,
			src.elements_in_strings*sizeof(cacheblock_t));
		(void) memcpy(dst+src.elements_in_strings, src.allocated,
			(n-src.elements_in_strings)*sizeof(cacheblock_t));
	} else {
		(void) memcpy(dst, src.strings, n*sizeof(cacheblock_t));
	}
}